

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  bool bVar1;
  char *pcVar2;
  string *psVar3;
  string *in_RDI;
  FilePath result;
  FilePath output_name;
  char *colon;
  char *gtest_output_flag;
  FilePath *in_stack_fffffffffffffd38;
  FilePath *in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  FilePath *in_stack_fffffffffffffd50;
  allocator *paVar4;
  FilePath *in_stack_fffffffffffffd90;
  FilePath *in_stack_fffffffffffffd98;
  string local_238 [8];
  FilePath *in_stack_fffffffffffffdd0;
  FilePath *in_stack_fffffffffffffdd8;
  FilePath local_1f8;
  undefined4 local_1d8;
  allocator local_1d1;
  string local_1d0 [71];
  allocator local_189;
  string local_188 [103];
  allocator local_121;
  string local_120 [32];
  FilePath local_100;
  allocator local_d9;
  string local_d8 [71];
  allocator local_91;
  string local_90 [64];
  FilePath local_50;
  char *local_30;
  allocator local_11;
  char *local_10;
  
  local_10 = (char *)std::__cxx11::string::c_str();
  if (local_10 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_11);
    std::allocator<char>::~allocator((allocator<char> *)&local_11);
  }
  else {
    local_30 = strchr(local_10,0x3a);
    if (local_30 == (char *)0x0) {
      UnitTest::GetInstance();
      pcVar2 = UnitTest::original_working_dir((UnitTest *)0x1469cc);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,pcVar2,&local_91);
      FilePath::FilePath(in_stack_fffffffffffffd50,
                         (string *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
      paVar4 = &local_d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,"test_detail.xml",paVar4);
      FilePath::FilePath(in_stack_fffffffffffffd50,
                         (string *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
      FilePath::ConcatPaths(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      psVar3 = FilePath::string_abi_cxx11_(&local_50);
      std::__cxx11::string::string((string *)in_RDI,(string *)psVar3);
      FilePath::~FilePath((FilePath *)0x146aab);
      FilePath::~FilePath((FilePath *)0x146ab8);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      FilePath::~FilePath((FilePath *)0x146adf);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
    }
    else {
      pcVar2 = local_30 + 1;
      paVar4 = &local_121;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_120,pcVar2,paVar4);
      FilePath::FilePath(in_stack_fffffffffffffd50,
                         (string *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
      bVar1 = FilePath::IsAbsolutePath(in_stack_fffffffffffffd40);
      if (!bVar1) {
        UnitTest::GetInstance();
        pcVar2 = UnitTest::original_working_dir((UnitTest *)0x146c89);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_188,pcVar2,&local_189);
        FilePath::FilePath(in_stack_fffffffffffffd50,
                           (string *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
        in_stack_fffffffffffffd50 = (FilePath *)(local_30 + 1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1d0,(char *)in_stack_fffffffffffffd50,&local_1d1);
        FilePath::FilePath(in_stack_fffffffffffffd50,
                           (string *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
        FilePath::ConcatPaths(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
        FilePath::operator=(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        FilePath::~FilePath((FilePath *)0x146d67);
        FilePath::~FilePath((FilePath *)0x146d74);
        std::__cxx11::string::~string(local_1d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
        FilePath::~FilePath((FilePath *)0x146d9b);
        std::__cxx11::string::~string(local_188);
        std::allocator<char>::~allocator((allocator<char> *)&local_189);
      }
      bVar1 = FilePath::IsDirectory(in_stack_fffffffffffffd50);
      if (bVar1) {
        GetCurrentExecutableName();
        GetOutputFormat_abi_cxx11_();
        std::__cxx11::string::c_str();
        FilePath::GenerateUniqueFileName
                  (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,(char *)paVar4);
        std::__cxx11::string::~string(local_238);
        FilePath::~FilePath((FilePath *)0x146fc0);
        psVar3 = FilePath::string_abi_cxx11_(&local_1f8);
        std::__cxx11::string::string((string *)in_RDI,(string *)psVar3);
        local_1d8 = 1;
        FilePath::~FilePath((FilePath *)0x146ffe);
      }
      else {
        psVar3 = FilePath::string_abi_cxx11_(&local_100);
        std::__cxx11::string::string((string *)in_RDI,(string *)psVar3);
        local_1d8 = 1;
      }
      FilePath::~FilePath((FilePath *)0x147076);
    }
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  if (gtest_output_flag == NULL)
    return "";

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == NULL)
    return internal::FilePath::ConcatPaths(
        internal::FilePath(
            UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(kDefaultOutputFile)).string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    // TODO(wan@google.com): on Windows \some\path is not an absolute
    // path (as its meaning depends on the current drive), yet the
    // following logic for turning it into an absolute path is wrong.
    // Fix it.
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory())
    return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}